

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayMapMethod::eval
          (ArrayMapMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  ConstantValue *pCVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDX;
  EvalContext *this_00;
  ConstantValue *in_RDI;
  Elements results_2;
  SVQueue results_1;
  anon_class_24_3_0a969f77 doMap;
  ConstantValue cv;
  type *val;
  type *key;
  iterator __end4;
  iterator __begin4;
  AssociativeArray *__range4;
  AssociativeArray results;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  type *iterVar;
  type *iterExpr;
  ConstantValue arr;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  EvalContext *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  SystemCallInfo *in_stack_fffffffffffffd70;
  ConstantValue *in_stack_fffffffffffffd90;
  ValueSymbol *in_stack_fffffffffffffd98;
  ConstantValue *container;
  anon_class_24_3_0a969f77 *this_01;
  SVQueue *in_stack_fffffffffffffdf8;
  SVQueue *in_stack_fffffffffffffe00;
  anon_class_24_3_0a969f77 *in_stack_fffffffffffffe08;
  _Self local_140;
  _Self local_138;
  AssociativeArray *local_130;
  ConstantValue *local_a8;
  type *local_88;
  type *local_80;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> local_78;
  uint local_68;
  ConstantValue local_58;
  EvalContext *local_28;
  
  container = in_RDI;
  local_28 = in_RDX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  this_01 = (anon_class_24_3_0a969f77 *)&local_58;
  Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x730c3a);
  if (bVar1) {
    local_78 = CallExpression::SystemCallInfo::getIteratorInfo(in_stack_fffffffffffffd70);
    this_00 = (EvalContext *)local_78.second;
    local_80 = std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                         ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                          0x730cce);
    local_88 = std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                         ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                          0x730ce0);
    EvalContext::disableCaching(this_00);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffd60,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pCVar2 = EvalContext::createLocal(local_28,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x730d5a);
    local_a8 = pCVar2;
    bVar1 = slang::ConstantValue::isMap((ConstantValue *)0x730d74);
    if (bVar1) {
      AssociativeArray::AssociativeArray((AssociativeArray *)in_stack_fffffffffffffd60);
      slang::ConstantValue::map((ConstantValue *)0x730d97);
      local_130 = CopyPtr<slang::AssociativeArray>::operator*
                            ((CopyPtr<slang::AssociativeArray> *)0x730da8);
      local_138._M_node =
           (_Base_ptr)
           std::
           map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ::begin((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      local_140._M_node =
           (_Base_ptr)
           std::
           map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ::end((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      while( true ) {
        bVar1 = std::operator==(&local_138,&local_140);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
        operator*((_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_> *
                  )0x730e07);
        std::get<0ul,slang::ConstantValue_const,slang::ConstantValue>
                  ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)0x730e1c);
        std::get<1ul,slang::ConstantValue_const,slang::ConstantValue>
                  ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)0x730e31);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffd60,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68)
                         ,in_stack_fffffffffffffd60);
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x730e7f);
        if (bVar1) {
          std::
          map<slang::ConstantValue,slang::ConstantValue,std::less<slang::ConstantValue>,std::allocator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>>
          ::emplace<slang::ConstantValue_const&,slang::ConstantValue>
                    ((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      *)in_stack_fffffffffffffd70,
                     (ConstantValue *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     (ConstantValue *)in_stack_fffffffffffffd60);
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd60,
                     (nullptr_t)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        }
        local_68 = (uint)!bVar1;
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x730f89);
        if (local_68 != 0) goto LAB_00730fc9;
        std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
        operator++((_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                    *)in_stack_fffffffffffffd60);
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffd70,
                 (AssociativeArray *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      local_68 = 1;
LAB_00730fc9:
      AssociativeArray::~AssociativeArray((AssociativeArray *)in_stack_fffffffffffffd60);
    }
    else {
      bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x73102d);
      if (bVar1) {
        SVQueue::SVQueue((SVQueue *)in_stack_fffffffffffffd60);
        pCVar2 = (ConstantValue *)slang::ConstantValue::queue((ConstantValue *)0x731052);
        CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x731063);
        bVar1 = const::{lambda(auto:1&,auto:2&)#1}::operator()
                          (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8);
        if (bVar1) {
          slang::ConstantValue::ConstantValue
                    (pCVar2,(SVQueue *)CONCAT17(bVar1,in_stack_fffffffffffffd68));
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd60,
                     (nullptr_t)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        }
        local_68 = 1;
        SVQueue::~SVQueue((SVQueue *)0x7310fa);
      }
      else {
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x73110c);
        slang::ConstantValue::getVariant_abi_cxx11_(&local_58);
        in_stack_fffffffffffffd60 =
             (EvalContext *)
             std::
             get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)0x731121);
        bVar1 = const::{lambda(auto:1&,auto:2&)#1}::operator()
                          (this_01,(vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                    *)container,
                           (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           in_RDI);
        if (bVar1) {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd60,
                     (Elements *)CONCAT17(bVar1,in_stack_fffffffffffffd58));
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd60,
                     (nullptr_t)CONCAT17(bVar1,in_stack_fffffffffffffd58));
        }
        local_68 = 1;
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                   in_stack_fffffffffffffd70);
      }
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                   *)in_stack_fffffffffffffd60);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffd60,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    local_68 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x7311e9);
  return container;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        auto guard = context.disableCaching();
        auto iterVal = context.createLocal(iterVar);

        if (arr.isMap()) {
            AssociativeArray results;
            for (auto& [key, val] : *arr.map()) {
                *iterVal = val;
                ConstantValue cv = iterExpr->eval(context);
                if (!cv)
                    return nullptr;

                results.emplace(key, std::move(cv));
            }
            return results;
        }
        else {
            auto doMap = [&, ie = iterExpr](auto& container, auto& results) {
                for (auto& elem : container) {
                    *iterVal = elem;
                    ConstantValue cv = ie->eval(context);
                    if (!cv)
                        return false;

                    results.emplace_back(std::move(cv));
                }
                return true;
            };

            if (arr.isQueue()) {
                SVQueue results;
                if (!doMap(*arr.queue(), results))
                    return nullptr;
                return results;
            }
            else {
                ConstantValue::Elements results;
                if (!doMap(std::get<ConstantValue::Elements>(arr.getVariant()), results))
                    return nullptr;
                return results;
            }
        }
    }